

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O2

RowGroup * __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
          (SegmentTree<duckdb::RowGroup,_true> *this,SegmentLock *l)

{
  RowGroup *pRVar1;
  
  if ((this->nodes).
      super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->nodes).
      super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    LoadNextSegment(this,l);
  }
  pRVar1 = GetRootSegmentInternal(this);
  return pRVar1;
}

Assistant:

T *GetRootSegment(SegmentLock &l) {
		if (nodes.empty()) {
			LoadNextSegment(l);
		}
		return GetRootSegmentInternal();
	}